

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

void __thiscall ON_DimStyle::ON_DimStyle(ON_DimStyle *this)

{
  undefined8 uVar1;
  ON_Color OVar2;
  MaskType MVar3;
  MaskFrame MVar4;
  uchar uVar5;
  double dVar6;
  ON__UINT8 OVar7;
  ON__UINT8 OVar8;
  ON__UINT8 OVar9;
  ON__UINT8 OVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  
  ON_ModelComponent::ON_ModelComponent(&this->super_ON_ModelComponent,DimStyle);
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_0080f070;
  this->m_extextension = 0.5;
  this->m_extoffset = 0.5;
  this->m_arrowsize = 1.0;
  this->m_leaderarrowsize = 1.0;
  this->m_centermark = 0.5;
  this->m_centermark_style = Mark;
  this->m_textgap = 0.25;
  this->m_textheight = 1.0;
  this->m_dim_text_location = AboveDimLine;
  this->m_dimradial_text_location = InDimLine;
  this->m_angleformat = DecimalDegrees;
  this->m_angleresolution = 2;
  this->m_dimension_length_display = ModelUnits;
  this->m_alternate_dimension_length_display = ModelUnits;
  this->m_lengthresolution = 2;
  this->m_alternate_lengthresolution = 2;
  this->m_lengthfactor = 1.0;
  this->m_alternate_lengthfactor = 1.0;
  ON_Font::ON_Font(&this->m_font_characteristics,&ON_Font::Default);
  this->m_managed_font = &ON_Font::Default;
  *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
       ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar1;
  *(undefined4 *)((this->m_text_position_properties_hash).m_digest + 0x10) =
       ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  *(undefined8 *)(this->m_text_position_properties_hash).m_digest =
       ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  *(undefined8 *)((this->m_text_position_properties_hash).m_digest + 8) = uVar1;
  uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  *(undefined8 *)(this->m_reserved_hash2).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  *(undefined8 *)((this->m_reserved_hash2).m_digest + 8) = uVar1;
  *(undefined4 *)((this->m_reserved_hash2).m_digest + 0x10) =
       ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  *(undefined8 *)(this->m_parent_dim_style_content_hash).m_digest =
       ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  *(undefined8 *)((this->m_parent_dim_style_content_hash).m_digest + 8) = uVar1;
  *(undefined4 *)((this->m_parent_dim_style_content_hash).m_digest + 0x10) =
       ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  this->m_bAlternate = false;
  this->m_bForceDimLine = true;
  this->m_ArrowFit = Auto;
  this->m_TextFit = Auto;
  this->m_decimal_separator = L'.';
  ON_wString::ON_wString(&this->m_prefix);
  ON_wString::ON_wString(&this->m_suffix);
  ON_wString::ON_wString(&this->m_alternate_prefix);
  ON_wString::ON_wString(&this->m_alternate_suffix);
  this->m_field_override_parent_bits0 = 0;
  this->m_field_override_parent_bits1 = 0;
  this->m_field_override_parent_bits2 = 0;
  this->m_field_override_parent_bits3 = 0;
  this->m_dimextension = 0.0;
  this->m_bSuppressExtension1 = false;
  this->m_bSuppressExtension2 = false;
  this->m_bReserved1 = false;
  this->m_bReserved2 = false;
  this->m_field_override_parent_count = 0;
  this->m_tolerance_format = None;
  this->m_tolerance_resolution = 4;
  this->m_tolerance_upper_value = 0.0;
  this->m_tolerance_lower_value = 0.0;
  this->m_tolerance_height_scale = 0.7;
  this->m_baseline_spacing = 3.0;
  uVar11 = ON_TextMask::None.m_content_hash.m_digest._4_8_;
  uVar1 = ON_TextMask::None._16_8_;
  dVar6 = ON_TextMask::None.m_mask_border;
  MVar3 = ON_TextMask::None.m_mask_type;
  MVar4 = ON_TextMask::None.m_mask_frame;
  uVar5 = ON_TextMask::None.m_reserved2;
  OVar2.field_0 = (anon_union_4_2_6147a14e_for_ON_Color_15)ON_TextMask::None.m_mask_color;
  (this->m_text_mask).m_bDrawMask = ON_TextMask::None.m_bDrawMask;
  (this->m_text_mask).m_mask_type = MVar3;
  (this->m_text_mask).m_mask_frame = MVar4;
  (this->m_text_mask).m_reserved2 = uVar5;
  (this->m_text_mask).m_mask_color = (ON_Color)OVar2.field_0;
  (this->m_text_mask).m_mask_border = dVar6;
  uVar12 = ON_TextMask::None._16_8_;
  ON_TextMask::None.m_reserved3 = (uint)uVar1;
  ON_TextMask::None.m_content_hash.m_digest[0] = SUB81(uVar1,4);
  OVar7 = ON_TextMask::None.m_content_hash.m_digest[0];
  ON_TextMask::None.m_content_hash.m_digest[1] = SUB81(uVar1,5);
  OVar8 = ON_TextMask::None.m_content_hash.m_digest[1];
  ON_TextMask::None.m_content_hash.m_digest[2] = SUB81(uVar1,6);
  OVar9 = ON_TextMask::None.m_content_hash.m_digest[2];
  ON_TextMask::None.m_content_hash.m_digest[3] = SUB81(uVar1,7);
  OVar10 = ON_TextMask::None.m_content_hash.m_digest[3];
  (this->m_text_mask).m_reserved3 = ON_TextMask::None.m_reserved3;
  ON_TextMask::None._16_8_ = uVar12;
  (this->m_text_mask).m_content_hash.m_digest[0] = OVar7;
  (this->m_text_mask).m_content_hash.m_digest[1] = OVar8;
  (this->m_text_mask).m_content_hash.m_digest[2] = OVar9;
  (this->m_text_mask).m_content_hash.m_digest[3] = OVar10;
  *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 4) = uVar11;
  *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 0xc) =
       ON_TextMask::None.m_content_hash.m_digest._12_8_;
  this->m_dimscale_source = 0;
  (this->m_source_dimstyle).Data1 = 0;
  (this->m_source_dimstyle).Data2 = 0;
  (this->m_source_dimstyle).Data3 = 0;
  (this->m_source_dimstyle).Data4[0] = '\0';
  (this->m_source_dimstyle).Data4[1] = '\0';
  (this->m_source_dimstyle).Data4[2] = '\0';
  (this->m_source_dimstyle).Data4[3] = '\0';
  (this->m_source_dimstyle).Data4[4] = '\0';
  (this->m_source_dimstyle).Data4[5] = '\0';
  (this->m_source_dimstyle).Data4[6] = '\0';
  (this->m_source_dimstyle).Data4[7] = '\0';
  this->m_ext_line_color_source = '\0';
  OVar2 = ON_Color::Black;
  this->m_dim_line_color_source = '\0';
  this->m_arrow_color_source = '\0';
  this->m_text_color_source = '\0';
  (this->m_ext_line_color).field_0 = ON_Color::Black.field_0;
  (this->m_dim_line_color).field_0 = OVar2.field_0;
  (this->m_arrow_color).field_0 = OVar2.field_0;
  (this->m_text_color).field_0 = OVar2.field_0;
  this->m_ext_line_plot_color_source = '\0';
  this->m_dim_line_plot_color_source = '\0';
  this->m_arrow_plot_color_source = '\0';
  this->m_text_plot_color_source = '\0';
  (this->m_ext_line_plot_color).field_0 = OVar2.field_0;
  (this->m_dim_line_plot_color).field_0 = OVar2.field_0;
  (this->m_arrow_plot_color).field_0 = OVar2.field_0;
  (this->m_text_plot_color).field_0 = OVar2.field_0;
  this->m_ext_line_plot_weight_source = '\0';
  this->m_dim_line_plot_weight_source = '\0';
  this->m_ext_line_plot_weight_mm = 0.0;
  this->m_dim_line_plot_weight_mm = 0.0;
  this->m_fixed_extension_len = 1.0;
  this->m_fixed_extension_len_on = false;
  this->m_ReservedChar1 = '\0';
  this->m_ReservedShort1 = 0;
  this->m_ReservedInt1 = 0;
  this->m_text_rotation = 0.0;
  this->m_alternate_tolerance_resolution = 4;
  this->m_tol_textheight_fraction = 0.6;
  this->m_suppress_arrow1 = false;
  this->m_suppress_arrow2 = false;
  this->m_ReservedShort2 = 0;
  this->m_textmove_leader = 0;
  this->m_arclength_sym = 0;
  this->m_stack_textheight_fraction = 0.7;
  this->m_stack_format = StackHorizontal;
  this->m_alt_round = 0.0;
  this->m_round = 0.0;
  *(undefined8 *)((long)&this->m_round + 4) = 0;
  *(undefined8 *)((long)&this->m_angular_round + 4) = 0;
  this->m_arrow_type_1 = SolidTriangle;
  this->m_arrow_type_2 = SolidTriangle;
  this->m_leader_arrow_type = SolidTriangle;
  (this->m_arrow_block_id_1).Data1 = 0;
  (this->m_arrow_block_id_1).Data2 = 0;
  (this->m_arrow_block_id_1).Data3 = 0;
  (this->m_arrow_block_id_1).Data4[0] = '\0';
  (this->m_arrow_block_id_1).Data4[1] = '\0';
  (this->m_arrow_block_id_1).Data4[2] = '\0';
  (this->m_arrow_block_id_1).Data4[3] = '\0';
  (this->m_arrow_block_id_1).Data4[4] = '\0';
  (this->m_arrow_block_id_1).Data4[5] = '\0';
  (this->m_arrow_block_id_1).Data4[6] = '\0';
  (this->m_arrow_block_id_1).Data4[7] = '\0';
  (this->m_arrow_block_id_2).Data1 = 0;
  (this->m_arrow_block_id_2).Data2 = 0;
  (this->m_arrow_block_id_2).Data3 = 0;
  (this->m_arrow_block_id_2).Data4[0] = '\0';
  (this->m_arrow_block_id_2).Data4[1] = '\0';
  (this->m_arrow_block_id_2).Data4[2] = '\0';
  (this->m_arrow_block_id_2).Data4[3] = '\0';
  (this->m_arrow_block_id_2).Data4[4] = '\0';
  (this->m_arrow_block_id_2).Data4[5] = '\0';
  (this->m_arrow_block_id_2).Data4[6] = '\0';
  (this->m_arrow_block_id_2).Data4[7] = '\0';
  (this->m_leader_arrow_block_id).Data1 = 0;
  (this->m_leader_arrow_block_id).Data2 = 0;
  (this->m_leader_arrow_block_id).Data3 = 0;
  (this->m_leader_arrow_block_id).Data4[0] = '\0';
  (this->m_leader_arrow_block_id).Data4[1] = '\0';
  (this->m_leader_arrow_block_id).Data4[2] = '\0';
  (this->m_leader_arrow_block_id).Data4[3] = '\0';
  (this->m_leader_arrow_block_id).Data4[4] = '\0';
  (this->m_leader_arrow_block_id).Data4[5] = '\0';
  (this->m_leader_arrow_block_id).Data4[6] = '\0';
  (this->m_leader_arrow_block_id).Data4[7] = '\0';
  this->m_text_vertical_alignment = Top;
  this->m_text_horizontal_alignment = Left;
  this->m_leader_text_vertical_alignment = Middle;
  this->m_leader_text_horizontal_alignment = Left;
  this->m_leader_content_angle_style = Horizontal;
  this->m_leader_curve_type = Polyline;
  this->m_leader_content_angle = 0.0;
  this->m_leader_has_landing = true;
  this->m_leader_landing_length = 1.0;
  this->m_draw_forward = true;
  this->m_signed_ordinate = true;
  ON_ScaleValue::ON_ScaleValue(&this->m_scale_value,&ON_ScaleValue::OneToOne);
  this->m_dimstyle_unitsystem = None;
  this->m_text_orientation = InPlane;
  this->m_leader_text_orientation = InPlane;
  this->m_dim_text_orientation = InPlane;
  this->m_dimradial_text_orientation = InPlane;
  this->m_dim_text_angle_style = Aligned;
  this->m_dimradial_text_angle_style = Horizontal;
  this->m_text_underlined = false;
  this->m_parent_dimstyle_managed_font = (ON_Font *)0x0;
  return;
}

Assistant:

ON_DimStyle::ON_DimStyle()
  : ON_ModelComponent(ON_ModelComponent::Type::DimStyle)
{
}